

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O3

uint32_t __thiscall spirv_cross::CFG::find_common_dominator(CFG *this,uint32_t a,uint32_t b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  const_iterator cVar3;
  undefined8 local_38;
  
  if (a != b) {
    local_38 = in_RAX;
    do {
      uVar1 = get_visit_order(this,a);
      uVar2 = get_visit_order(this,b);
      if (uVar1 < uVar2) {
        local_38 = CONCAT44(local_38._4_4_,a);
        cVar3 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->immediate_dominators)._M_h,(key_type *)&local_38);
        if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          a = 0;
        }
        else {
          a = *(uint32_t *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
        }
      }
      else {
        local_38 = CONCAT44(b,(key_type)local_38);
        cVar3 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->immediate_dominators)._M_h,(key_type *)((long)&local_38 + 4));
        if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          b = 0;
        }
        else {
          b = *(uint32_t *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
        }
      }
    } while (a != b);
  }
  return a;
}

Assistant:

uint32_t CFG::find_common_dominator(uint32_t a, uint32_t b) const
{
	while (a != b)
	{
		if (get_visit_order(a) < get_visit_order(b))
			a = get_immediate_dominator(a);
		else
			b = get_immediate_dominator(b);
	}
	return a;
}